

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O2

void FAudio_INTERNAL_DecodeStereoMSADPCM
               (FAudioVoice *voice,FAudioBuffer *buffer,float *decodeCache,uint32_t samples)

{
  uint8_t predictor;
  uint8_t predictor_00;
  ushort uVar1;
  FAudioWaveFormatEx *pFVar2;
  undefined8 uVar3;
  float *pfVar4;
  int16_t iVar5;
  uint uVar6;
  uint8_t *puVar7;
  long lVar8;
  int16_t r_delta;
  int16_t l_delta;
  int16_t local_1048;
  int16_t local_1046;
  int16_t local_1044;
  int16_t local_1042;
  int16_t local_1040;
  int16_t local_103e;
  uint local_103c;
  uint local_1038;
  uint local_1034;
  FAudioVoice *local_1030;
  ulong local_1028;
  ulong local_1020;
  ulong local_1018;
  float *local_1010;
  undefined8 local_1008;
  int16_t aiStack_1000 [2024];
  
  pFVar2 = (voice->field_19).src.format;
  uVar6 = (voice->field_19).src.curBufferOffset;
  local_103c = (uint)pFVar2[1].wFormatTag;
  local_1020 = (ulong)uVar6 % (ulong)local_103c;
  puVar7 = buffer->pAudioData + (uVar6 / local_103c) * (uint)pFVar2->nBlockAlign;
  local_1018 = 0;
  local_1038 = samples;
  local_1030 = voice;
  while (local_1034 = local_1038 - (uint)local_1018,
        (uint)local_1018 <= local_1038 && local_1034 != 0) {
    local_1028 = (ulong)(local_103c - (int)local_1020);
    uVar1 = ((local_1030->field_19).src.format)->nBlockAlign;
    predictor = *puVar7;
    predictor_00 = puVar7[1];
    local_103e = *(int16_t *)(puVar7 + 2);
    local_1040 = *(int16_t *)(puVar7 + 4);
    uVar3 = *(undefined8 *)(puVar7 + 6);
    local_1042 = (int16_t)uVar3;
    local_1044 = (int16_t)((ulong)uVar3 >> 0x10);
    local_1046 = (int16_t)((ulong)uVar3 >> 0x20);
    local_1048 = (int16_t)((ulong)uVar3 >> 0x30);
    local_1008 = CONCAT44((int)uVar3,(int)((ulong)uVar3 >> 0x20));
    local_1010 = decodeCache;
    for (lVar8 = 0; pfVar4 = local_1010, uVar1 - 0xe != (int)lVar8; lVar8 = lVar8 + 1) {
      iVar5 = FAudio_INTERNAL_ParseNibble
                        (puVar7[lVar8 + 0xe] >> 4,predictor,&local_103e,&local_1042,&local_1046);
      aiStack_1000[lVar8 * 2] = iVar5;
      iVar5 = FAudio_INTERNAL_ParseNibble
                        (puVar7[lVar8 + 0xe] & 0xf,predictor_00,&local_1040,&local_1044,&local_1048)
      ;
      aiStack_1000[lVar8 * 2 + 1] = iVar5;
    }
    uVar6 = (uint)local_1028;
    if (local_1034 < (uint)local_1028) {
      uVar6 = local_1034;
    }
    (*FAudio_INTERNAL_Convert_S16_To_F32)
              ((int16_t *)((long)&local_1008 + (ulong)(uint)((int)local_1020 * 2) * 2),local_1010,
               uVar6 * 2);
    decodeCache = pfVar4 + uVar6 * 2;
    puVar7 = puVar7 + lVar8 + 0xe;
    local_1020 = 0;
    local_1018 = (ulong)(uVar6 + (int)local_1018);
  }
  return;
}

Assistant:

void FAudio_INTERNAL_DecodeStereoMSADPCM(
	FAudioVoice *voice,
	FAudioBuffer *buffer,
	float *decodeCache,
	uint32_t samples
) {
	/* Loop variables */
	uint32_t copy, done = 0;

	/* Read pointers */
	uint8_t *buf;
	int32_t midOffset;

	/* PCM block cache */
	int16_t blockCache[2024]; /* Max block size */

	/* Align, block size */
	uint32_t bsize = ((FAudioADPCMWaveFormat*) voice->src.format)->wSamplesPerBlock;

	LOG_FUNC_ENTER(voice->audio)

	/* Where are we starting? */
	buf = (uint8_t*) buffer->pAudioData + (
		(voice->src.curBufferOffset / bsize) *
		voice->src.format->nBlockAlign
	);

	/* Are we starting in the middle? */
	midOffset = (voice->src.curBufferOffset % bsize);

	/* Read in each block directly to the decode cache */
	while (done < samples)
	{
		copy = FAudio_min(samples - done, bsize - midOffset);
		FAudio_INTERNAL_DecodeStereoMSADPCMBlock(
			&buf,
			blockCache,
			voice->src.format->nBlockAlign
		);
		FAudio_INTERNAL_Convert_S16_To_F32(
			blockCache + (midOffset * 2),
			decodeCache,
			copy * 2
		);
		decodeCache += copy * 2;
		done += copy;
		midOffset = 0;
	}
	LOG_FUNC_EXIT(voice->audio)
}